

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::parse_go_tags
          (t_go_generator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags,string *in)

{
  char *pcVar1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  string value;
  string key;
  
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  lVar4 = 0;
  key.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  pcVar1 = (in->_M_dataplus)._M_p;
  lVar3 = 0;
  pcVar5 = pcVar1;
  do {
    if (pcVar1 + in->_M_string_length <= pcVar5) {
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      return;
    }
    if (lVar3 == 0 && lVar4 == 0) {
      if (*pcVar1 == ' ') {
LAB_001c28e2:
        if (pcVar1[lVar4] == ' ') {
          lVar3 = 2;
          goto LAB_001c291c;
        }
      }
LAB_001c28ed:
      if (pcVar1[lVar4] == ':') {
        lVar4 = lVar4 + 1;
        pcVar5 = pcVar5 + 1;
        lVar3 = 1;
      }
      else {
        std::__cxx11::string::push_back((char)&key);
        lVar3 = 0;
      }
    }
    else {
      if (lVar3 == 0) goto LAB_001c28ed;
      if (lVar3 != 1) goto LAB_001c28e2;
      if (pcVar1[lVar4] == '\"') {
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](tags,&key);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        std::__cxx11::string::assign((char *)&value);
        std::__cxx11::string::_M_assign((string *)&key);
        lVar3 = 2;
      }
      else {
        std::__cxx11::string::push_back((char)&value);
        lVar3 = 1;
      }
    }
LAB_001c291c:
    pcVar5 = pcVar5 + 1;
    lVar4 = lVar4 + 1;
    pcVar1 = (in->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void t_go_generator::parse_go_tags(map<string,string>* tags, const string in) {
  string key;
  string value;

  size_t mode=0; // 0/1/2 for key/value/whitespace
  size_t index=0;
  for (auto it=in.begin(); it<in.end(); ++it, ++index) {
      // Normally we start in key mode because the IDL is expected to be in
      // (go.tag="key:\"value\"") format, but if there is leading whitespace
      // we need to start in whitespace mode.
      if (index==0 && mode==0 && in[index]==' ') {
        mode=2;
      }

      if (mode==2) {
          if (in[index]==' ') {
              continue;
          }
          mode=0;
      }

      if (mode==0) {
          if (in[index]==':') {
              mode=1;
              index++;
              it++;
              continue;
          }
          key+=in[index];
      } else if (mode==1) {
          if (in[index]=='"') {
              (*tags)[key]=value;
              key=value="";
              mode=2;
              continue;
          }
          value+=in[index];
      }
  }
}